

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

bool __thiscall pbrt::BilinearPatch::IsRectangle(BilinearPatch *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Float d2 [4];
  
  lVar23 = (long)this->blpIndex * 0x10;
  lVar15 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar22 = *(long *)(lVar15 + 0x10);
  lVar15 = *(long *)(lVar15 + 0x18);
  pfVar1 = (float *)(lVar15 + (long)*(int *)(lVar22 + lVar23) * 0xc);
  pfVar2 = (float *)(lVar15 + (long)*(int *)(lVar22 + 8 + lVar23) * 0xc);
  fVar32 = *pfVar1;
  fVar5 = *pfVar2;
  if ((fVar32 == fVar5) && (!NAN(fVar32) && !NAN(fVar5))) {
    if ((pfVar1[1] == pfVar2[1]) && (!NAN(pfVar1[1]) && !NAN(pfVar2[1]))) {
      if ((pfVar1[2] == pfVar2[2]) && (!NAN(pfVar1[2]) && !NAN(pfVar2[2]))) {
        return false;
      }
    }
  }
  pfVar3 = (float *)(lVar15 + (long)*(int *)(lVar22 + 0xc + lVar23) * 0xc);
  fVar6 = *pfVar3;
  if ((fVar5 == fVar6) && (!NAN(fVar5) && !NAN(fVar6))) {
    if ((pfVar2[1] == pfVar3[1]) && (!NAN(pfVar2[1]) && !NAN(pfVar3[1]))) {
      if ((pfVar2[2] == pfVar3[2]) && (!NAN(pfVar2[2]) && !NAN(pfVar3[2]))) {
        return false;
      }
    }
  }
  pfVar4 = (float *)(lVar15 + (long)*(int *)(lVar22 + 4 + lVar23) * 0xc);
  fVar7 = *pfVar4;
  if ((fVar6 == fVar7) && (!NAN(fVar6) && !NAN(fVar7))) {
    if ((pfVar3[1] == pfVar4[1]) && (!NAN(pfVar3[1]) && !NAN(pfVar4[1]))) {
      if ((pfVar3[2] == pfVar4[2]) && (!NAN(pfVar3[2]) && !NAN(pfVar4[2]))) {
        return false;
      }
    }
  }
  fVar8 = pfVar4[1];
  fVar9 = pfVar1[1];
  if ((fVar7 == fVar32) && (!NAN(fVar7) && !NAN(fVar32))) {
    if ((fVar8 == fVar9) && (!NAN(fVar8) && !NAN(fVar9))) {
      if ((pfVar4[2] == pfVar1[2]) && (!NAN(pfVar4[2]) && !NAN(pfVar1[2]))) {
        return false;
      }
    }
  }
  fVar10 = pfVar2[1];
  fVar11 = pfVar4[2];
  fVar12 = pfVar1[2];
  fVar13 = pfVar2[2];
  fVar16 = fVar8 - fVar9;
  fVar17 = fVar7 - fVar32;
  fVar18 = fVar5 - fVar32;
  fVar19 = fVar11 - fVar12;
  fVar20 = fVar10 - fVar9;
  fVar21 = fVar13 - fVar12;
  auVar24 = vmulss_avx512f(ZEXT416((uint)fVar19),ZEXT416((uint)fVar20));
  auVar25 = vfmsub213ss_avx512f(ZEXT416((uint)fVar21),ZEXT416((uint)fVar16),auVar24);
  auVar24 = vfnmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar19),ZEXT416((uint)fVar20));
  auVar26 = vaddss_avx512f(auVar25,auVar24);
  auVar24 = vmulss_avx512f(ZEXT416((uint)fVar17),ZEXT416((uint)fVar21));
  auVar27 = vfmsub213ss_avx512f(ZEXT416((uint)fVar19),ZEXT416((uint)fVar18),auVar24);
  auVar28 = vfnmadd213ss_avx512f(ZEXT416((uint)fVar21),ZEXT416((uint)fVar17),auVar24);
  auVar24 = vfmsub213ss_fma(ZEXT416((uint)fVar20),ZEXT416((uint)fVar17),
                            ZEXT416((uint)(fVar18 * fVar16)));
  auVar30 = vfnmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar16),
                             ZEXT416((uint)(fVar18 * fVar16)));
  fVar16 = pfVar3[1];
  fVar17 = pfVar3[2];
  auVar25 = vinsertps_avx512f(ZEXT416((uint)(fVar6 - fVar32)),auVar26,0x10);
  fVar18 = auVar30._0_4_ + auVar24._0_4_;
  auVar29 = vsubss_avx512f(ZEXT416((uint)fVar16),ZEXT416((uint)fVar9));
  auVar30._4_4_ = fVar18;
  auVar30._0_4_ = fVar18;
  auVar30._8_4_ = fVar18;
  auVar30._12_4_ = fVar18;
  auVar24 = vblendps_avx(ZEXT416((uint)(fVar17 - fVar12)),auVar30,2);
  auVar28 = ZEXT416((uint)(auVar27._0_4_ + auVar28._0_4_));
  auVar30 = vinsertps_avx512f(auVar29,auVar28,0x10);
  auVar27._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar27._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar27._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar27._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar25 = vfmadd213ps_avx512vl(auVar25,auVar25,auVar27);
  auVar25 = vfmadd231ps_avx512vl(auVar25,auVar24,auVar24);
  auVar25 = vsqrtps_avx512vl(auVar25);
  auVar24 = vdivps_avx(auVar24,auVar25);
  auVar30 = vmovshdup_avx512vl(auVar25);
  auVar27 = vdivss_avx512f(auVar29,auVar25);
  auVar29._0_4_ = (fVar6 - fVar32) / auVar25._0_4_;
  auVar29._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar28 = vdivss_avx512f(auVar28,auVar30);
  auVar30 = vdivss_avx512f(auVar26,auVar30);
  auVar25 = vmovshdup_avx(auVar24);
  auVar26 = vmulss_avx512f(auVar24,auVar25);
  auVar27 = vfmadd213ss_avx512f(auVar27,auVar28,auVar26);
  auVar24 = vfmsub213ss_avx512f(auVar24,auVar25,auVar26);
  auVar24 = vaddss_avx512f(auVar27,auVar24);
  auVar25 = vfmadd231ss_avx512f(auVar24,auVar30,auVar29);
  auVar24._8_4_ = 0x7fffffff;
  auVar24._0_8_ = 0x7fffffff7fffffff;
  auVar24._12_4_ = 0x7fffffff;
  auVar24 = vandps_avx512vl(auVar25,auVar24);
  if (auVar24._0_4_ <= 1e-05) {
    auVar24 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar7),0x10);
    fVar5 = (fVar32 + fVar5 + fVar7 + fVar6) * 0.25;
    fVar7 = (fVar10 + fVar9 + fVar8 + fVar16) * 0.25;
    fVar18 = (fVar12 + fVar13 + fVar11 + fVar17) * 0.25;
    auVar26._4_4_ = fVar5;
    auVar26._0_4_ = fVar5;
    auVar26._8_4_ = fVar5;
    auVar26._12_4_ = fVar5;
    auVar25 = vsubps_avx(auVar24,auVar26);
    auVar24 = vinsertps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar8),0x10);
    auVar33._4_4_ = fVar7;
    auVar33._0_4_ = fVar7;
    auVar33._8_4_ = fVar7;
    auVar33._12_4_ = fVar7;
    auVar30 = vsubps_avx(auVar24,auVar33);
    auVar24 = vinsertps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar11),0x10);
    auVar34._4_4_ = fVar18;
    auVar34._0_4_ = fVar18;
    auVar34._8_4_ = fVar18;
    auVar34._12_4_ = fVar18;
    auVar24 = vsubps_avx(auVar24,auVar34);
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)((fVar9 - fVar7) * (fVar9 - fVar7))),
                              ZEXT416((uint)(fVar32 - fVar5)),ZEXT416((uint)(fVar32 - fVar5)));
    auVar28._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar28._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar28._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar28._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar25 = vfmadd231ps_fma(auVar28,auVar25,auVar25);
    auVar30 = vfmadd231ss_fma(auVar26,ZEXT416((uint)(fVar12 - fVar18)),
                              ZEXT416((uint)(fVar12 - fVar18)));
    auVar24 = vfmadd231ps_fma(auVar25,auVar24,auVar24);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)((fVar16 - fVar7) * (fVar16 - fVar7))),
                              ZEXT416((uint)(fVar6 - fVar5)),ZEXT416((uint)(fVar6 - fVar5)));
    uVar14 = vmovlps_avx(auVar24);
    auVar24 = vfmadd231ss_fma(auVar25,ZEXT416((uint)(fVar17 - fVar18)),
                              ZEXT416((uint)(fVar17 - fVar18)));
    d2[3] = auVar24._0_4_;
    d2[1] = (Float)uVar14;
    fVar32 = auVar30._0_4_;
    auVar25._8_4_ = 0x7fffffff;
    auVar25._0_8_ = 0x7fffffff7fffffff;
    auVar25._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx512vl(ZEXT416((uint)(d2[1] - fVar32)),auVar25);
    if (auVar24._0_4_ / fVar32 <= 0.0001) {
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      lVar15 = 0;
      do {
        lVar22 = lVar15;
        if (lVar22 == 2) break;
        auVar24 = vandps_avx(ZEXT416((uint)(d2[lVar22 + 2] - fVar32)),auVar31);
        lVar15 = lVar22 + 1;
      } while (auVar24._0_4_ / fVar32 <= 0.0001);
      return 2 < lVar22 + 1U;
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    const BilinearPatchMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allBilinearMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }